

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

void __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::FindIndependentGroups(wasm::InsertOrderedSet<CFG::
Block*>&,wasm::InsertOrderedMap<CFG::Block*,wasm::InsertOrderedSet<CFG::Block*>>&,wasm::
InsertOrderedSet<CFG::Block*>*)::HelperClass::InvalidateWithChildren(CFG::Block__
          (void *this,Block *New)

{
  bool bVar1;
  size_type sVar2;
  reference ppBVar3;
  mapped_type *ppBVar4;
  InsertOrderedSet<CFG::Block_*> *this_00;
  BlockBranchMap *this_01;
  reference __in;
  type *__x;
  pointer ppVar5;
  Block *TargetOwner;
  _Self local_88;
  iterator Known;
  type *_;
  type *Target;
  _Self local_68;
  iterator __end5;
  iterator __begin5;
  BlockBranchMap *__range5;
  Block *Owner;
  Block *Invalidatee;
  undefined1 local_30 [8];
  BlockList ToInvalidate;
  Block *New_local;
  HelperClass *this_local;
  
  ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node._M_size
       = (size_t)New;
  std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::list
            ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)local_30);
  std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::push_back
            ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)local_30,
             (value_type *)
             &ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
              _M_node._M_size);
  while (sVar2 = std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::size
                           ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)local_30),
        sVar2 != 0) {
    ppBVar3 = std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::front
                        ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)local_30);
    Owner = *ppBVar3;
    std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::pop_front
              ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)local_30);
    ppBVar4 = std::
              map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
              ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                            *)((long)this + 8),&Owner);
    __range5 = (BlockBranchMap *)*ppBVar4;
    bVar1 = contains<wasm::InsertOrderedMap<CFG::Block*,wasm::InsertOrderedSet<CFG::Block*>>,CFG::Block*>
                      (*this,(Block **)&__range5);
    if (bVar1) {
      this_00 = ::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::
                operator[](*this,(Block **)&__range5);
      ::wasm::InsertOrderedSet<CFG::Block_*>::erase(this_00,&Owner);
    }
    ppBVar4 = std::
              map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
              ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                            *)((long)this + 8),&Owner);
    if (*ppBVar4 != (mapped_type)0x0) {
      ppBVar4 = std::
                map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                              *)((long)this + 8),&Owner);
      *ppBVar4 = (mapped_type)0x0;
      this_01 = &Owner->BranchesOut;
      __end5 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin(this_01);
      local_68._M_node =
           (_List_node_base *)::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end(this_01);
      while (bVar1 = std::operator!=(&__end5,&local_68), bVar1) {
        __in = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator*(&__end5)
        ;
        __x = std::get<0ul,CFG::Block*const,CFG::Branch*>(__in);
        Known._M_node = (_Base_ptr)std::get<1ul,CFG::Block*const,CFG::Branch*>(__in);
        local_88._M_node =
             (_Base_ptr)
             std::
             map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
             ::find((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                     *)((long)this + 8),__x);
        TargetOwner = (Block *)std::
                               map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                               ::end((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                                      *)((long)this + 8));
        bVar1 = std::operator!=(&local_88,(_Self *)&TargetOwner);
        if ((bVar1) &&
           (ppVar5 = std::_Rb_tree_iterator<std::pair<CFG::Block_*const,_CFG::Block_*>_>::operator->
                               (&local_88), ppVar5->second != (Block *)0x0)) {
          std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::push_back
                    ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)local_30,__x);
        }
        std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&__end5);
      }
    }
  }
  std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::~list
            ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)local_30);
  return;
}

Assistant:

void InvalidateWithChildren(Block* New) { // TODO: rename New
          // Being in the list means you need to be invalidated
          BlockList ToInvalidate;
          ToInvalidate.push_back(New);
          while (ToInvalidate.size() > 0) {
            Block* Invalidatee = ToInvalidate.front();
            ToInvalidate.pop_front();
            Block* Owner = Ownership[Invalidatee];
            // Owner may have been invalidated, do not add to IndependentGroups!
            if (contains(IndependentGroups, Owner)) {
              IndependentGroups[Owner].erase(Invalidatee);
            }
            // may have been seen before and invalidated already
            if (Ownership[Invalidatee]) {
              Ownership[Invalidatee] = nullptr;
              for (auto& [Target, _] : Invalidatee->BranchesOut) {
                auto Known = Ownership.find(Target);
                if (Known != Ownership.end()) {
                  Block* TargetOwner = Known->second;
                  if (TargetOwner) {
                    ToInvalidate.push_back(Target);
                  }
                }
              }
            }
          }
        }